

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

string * __thiscall
BCLog::Logger::GetLogPrefix_abi_cxx11_
          (string *__return_storage_ptr__,Logger *this,LogFlags category,Level level)

{
  const_iterator cVar1;
  Level extraout_EDX;
  Level extraout_EDX_00;
  Level extraout_EDX_01;
  Level level_00;
  LogFlags LVar2;
  byte bVar3;
  long in_FS_OFFSET;
  allocator<char> local_59;
  LogFlags local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  LVar2 = -(ulong)(category == NONE) | category;
  bVar3 = LVar2 != ALL | this->m_always_print_category_level;
  if (level == Info && bVar3 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"[",(allocator<char> *)&local_50);
    level_00 = extraout_EDX;
    if (bVar3 != 0) {
      local_58 = LVar2;
      if (LVar2 == ALL) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"all",&local_59);
      }
      else {
        cVar1 = std::
                _Hashtable<BCLog::LogFlags,_std::pair<const_BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<BCLog::LogFlags>,_std::hash<BCLog::LogFlags>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&LOG_CATEGORIES_BY_FLAG_abi_cxx11_._M_h,&local_58);
        if (cVar1.
            super__Node_iterator_base<std::pair<const_BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          __assert_fail("it != LOG_CATEGORIES_BY_FLAG.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/logging.cpp"
                        ,0xfd,"std::string LogCategoryToStr(BCLog::LogFlags)");
        }
        std::__cxx11::string::string
                  ((string *)&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)cVar1.
                          super__Node_iterator_base<std::pair<const_BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                          ._M_cur + 0x10));
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      level_00 = extraout_EDX_00;
    }
    if ((bVar3 & level == Debug & (this->m_always_print_category_level ^ 1U)) == 0) {
      if (bVar3 != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,":");
        level_00 = extraout_EDX_01;
      }
      LogLevelToStr_abi_cxx11_(&local_50,(Logger *)(ulong)level,level_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"] ");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string BCLog::Logger::GetLogPrefix(BCLog::LogFlags category, BCLog::Level level) const
{
    if (category == LogFlags::NONE) category = LogFlags::ALL;

    const bool has_category{m_always_print_category_level || category != LogFlags::ALL};

    // If there is no category, Info is implied
    if (!has_category && level == Level::Info) return {};

    std::string s{"["};
    if (has_category) {
        s += LogCategoryToStr(category);
    }

    if (m_always_print_category_level || !has_category || level != Level::Debug) {
        // If there is a category, Debug is implied, so don't add the level

        // Only add separator if we have a category
        if (has_category) s += ":";
        s += Logger::LogLevelToStr(level);
    }

    s += "] ";
    return s;
}